

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

size_t nivalis::detail::print_ast(ostream *os,AST *ast,Environment *env,size_t idx)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  const_reference pvVar4;
  vector<double,_std::allocator<double>_> *this;
  const_reference pvVar5;
  ostream *poVar6;
  const_iterator pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  Environment *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  ostream *in_RSI;
  ostream *in_RDI;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  size_t i;
  size_t n_args;
  size_t n_idx;
  string_view reprs;
  size_type in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  char *local_58;
  ulong local_48;
  undefined1 *local_38;
  char *in_stack_ffffffffffffffd8;
  
  pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
                     ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                      in_RSI,(size_type)in_RCX);
  OpCode::repr(pvVar4->opcode);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_38 = (undefined1 *)
             ((long)&(in_RCX->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 1);
  pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
                     ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                      in_RSI,(size_type)in_RCX);
  if (pvVar4->opcode == 0xc) {
    if (in_RDX == (vector<double,_std::allocator<double>_> *)0x0) {
      poVar6 = std::operator<<(in_RDI,"<function id=");
      pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_RSI,(size_type)in_RCX);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(pvVar4->field_1).call_info[0]);
      poVar6 = std::operator<<(poVar6,", ");
      pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_RSI,(size_type)in_RCX);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(pvVar4->field_1).call_info[1]);
      std::operator<<(poVar6," args>(");
    }
    else {
      this = in_RDX + 2;
      pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_RSI,(size_type)in_RCX);
      pvVar5 = std::
               vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                             *)this,(ulong)(pvVar4->field_1).call_info[0]);
      poVar6 = std::operator<<(in_RDI,(string *)pvVar5);
      std::operator<<(poVar6,"(");
    }
    pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
             operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_RSI,(size_type)in_RCX);
    uVar2 = (pvVar4->field_1).call_info[1];
    for (local_48 = 0; local_48 < uVar2; local_48 = local_48 + 1) {
      if (local_48 != 0) {
        std::operator<<(in_RDI,", ");
      }
      local_38 = (undefined1 *)
                 print_ast(in_RSI,(AST *)in_RDX,in_RCX,(size_t)in_stack_ffffffffffffffd8);
    }
    std::operator<<(in_RDI,")");
  }
  else {
    local_58 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffd0);
    pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0
                       );
    for (; local_58 != pvVar7; local_58 = local_58 + 1) {
      cVar1 = *local_58;
      if (cVar1 != '\t') {
        if (cVar1 == '\v') {
          pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                   operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                               *)in_RSI,(size_type)in_RCX);
          std::ostream::operator<<(in_RDI,(pvVar4->field_1).val);
        }
        else if (cVar1 == '\r') {
          if (in_RDX == (vector<double,_std::allocator<double>_> *)0x0) {
            poVar6 = std::operator<<(in_RDI,"@");
            pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                     operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                 *)in_RSI,(size_type)in_RCX);
            std::ostream::operator<<(poVar6,(pvVar4->field_1).ref);
          }
          else {
            pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                     operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                 *)in_RSI,(size_type)in_RCX);
            uVar3 = (pvVar4->field_1).ref;
            sVar8 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
            if (uVar3 < sVar8) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         in_RSI,(size_type)in_RCX);
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
              std::operator<<(in_RDI,(string *)pvVar9);
            }
            else {
              std::operator<<(in_RDI,"&NULL");
            }
          }
        }
        else if (cVar1 == '$') {
          in_stack_ffffffffffffff40 = std::operator<<(in_RDI,"$");
          pvVar4 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                   operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                               *)in_RSI,(size_type)in_RCX);
          std::ostream::operator<<(in_stack_ffffffffffffff40,(pvVar4->field_1).ref);
        }
        else if (cVar1 == '@') {
          local_38 = (undefined1 *)
                     print_ast(in_RSI,(AST *)in_RDX,in_RCX,(size_t)in_stack_ffffffffffffffd8);
        }
        else {
          std::operator<<(in_RDI,cVar1);
        }
      }
    }
  }
  return (size_t)local_38;
}

Assistant:

size_t print_ast(std::ostream& os, const Expr::AST& ast,
               const Environment* env, size_t idx) {
    std::string_view reprs = OpCode::repr(ast[idx].opcode);
    size_t n_idx = idx + 1;
    if (ast[idx].opcode == OpCode::call) {
        // Special handling for user function
        if (env != nullptr) {
            os << env->funcs[ast[idx].call_info[0]].name << "(";
        } else {
            os << "<function id=" << ast[idx].call_info[0] << ", " << ast[idx].call_info[1] << " args>(";
        }
        size_t n_args = ast[idx].call_info[1];
        for (size_t i = 0; i < n_args; ++i) {
            if (i) os << ", ";
            n_idx = print_ast(os, ast, env, n_idx);
        }
        os << ")";
    } else {
        for (char c : reprs) {
            switch(c) {
                case '@': n_idx = print_ast(os, ast, env, n_idx); break; // subexpr
                case '\v': os << ast[idx].val; break; // value
                case '\r':
                          if (env != nullptr) {
                              if (ast[idx].ref >= env->vars.size()) {
                                  os << "&NULL";
                                  break;
                              } os << env->varname.at(ast[idx].ref);
                          }
                          else os << "@" << ast[idx].ref;
                          break; // ref
                case '\t':
                          // Not used
                          break;
                case '$':
                          os << "$" << ast[idx].ref;
                          break;
                default: os << c;
            }
        }
    }
    return n_idx;
}